

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

int Gia_ManBuildFromMiniInt(Gia_Man_t *pNew,Vec_Int_t *vLeaves,Vec_Int_t *vAig,int fHash)

{
  int iVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  int *piVar8;
  int *piVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  
  iVar6 = vAig->nSize;
  uVar5 = (ulong)iVar6;
  if ((long)uVar5 < 1) {
    __assert_fail("Vec_IntSize(vAig) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x353,"int Gia_ManBuildFromMiniInt(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
  }
  puVar2 = (uint *)vAig->pArray;
  if (1 < (int)puVar2[uVar5 - 1]) {
    __assert_fail("Vec_IntEntryLast(vAig) < 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x354,"int Gia_ManBuildFromMiniInt(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
  }
  if (iVar6 == 2) {
    if (*puVar2 != 0) {
      __assert_fail("Vec_IntEntry(vAig, 0) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                    ,0x359,"int Gia_ManBuildFromMiniInt(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    if (vLeaves->nSize != 1) {
      __assert_fail("Vec_IntSize(vLeaves) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                    ,0x35a,"int Gia_ManBuildFromMiniInt(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    if (*vLeaves->pArray < 0) {
LAB_006ebc2e:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf5,"int Abc_LitNotCond(int, int)");
    }
    uVar4 = *vLeaves->pArray ^ (uint)(0 < (int)puVar2[1]);
  }
  else if (iVar6 == 1) {
    uVar4 = *puVar2;
  }
  else {
    if ((uVar5 & 1) == 0) {
      __assert_fail("Vec_IntSize(vAig) & 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                    ,0x361,"int Gia_ManBuildFromMiniInt(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    iVar6 = vAig->nSize;
    uVar7 = 0;
    if (iVar6 < 2) {
      uVar4 = 0;
    }
    else {
      iVar1 = vLeaves->nSize;
      lVar14 = 0;
      uVar12 = 0;
      do {
        piVar8 = vAig->pArray;
        uVar4 = piVar8[lVar14 * 2];
        if (((int)uVar4 < 0) || (uVar7 = piVar8[lVar14 * 2 + 1], (int)uVar7 < 0)) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf2,"int Abc_Lit2Var(int)");
        }
        uVar10 = uVar4 >> 1;
        uVar3 = uVar10 - iVar1;
        if ((int)uVar10 < iVar1) {
          if (vLeaves->nSize <= (int)uVar10) goto LAB_006ebc0f;
          piVar9 = vLeaves->pArray;
          uVar3 = uVar10;
        }
        else if (((int)uVar3 < 0) || (piVar9 = piVar8, iVar6 <= (int)uVar3)) goto LAB_006ebc0f;
        if (piVar9[uVar3] < 0) goto LAB_006ebc2e;
        uVar11 = uVar7 >> 1;
        uVar10 = uVar11 - iVar1;
        if ((int)uVar11 < iVar1) {
          if (vLeaves->nSize <= (int)uVar11) goto LAB_006ebc0f;
          piVar8 = vLeaves->pArray;
          uVar10 = uVar11;
        }
        else if (((int)uVar10 < 0) || (iVar6 <= (int)uVar10)) goto LAB_006ebc0f;
        if (piVar8[uVar10] < 0) goto LAB_006ebc2e;
        uVar4 = piVar9[uVar3] ^ uVar4 & 1;
        uVar7 = piVar8[uVar10] ^ uVar7 & 1;
        if (fHash == 0) {
          if (uVar4 != uVar7) {
            uVar4 = Gia_ManAppendAnd(pNew,uVar4,uVar7);
          }
        }
        else {
          uVar4 = Gia_ManHashAnd(pNew,uVar4,uVar7);
        }
        if (vAig->nSize <= (int)lVar14) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        vAig->pArray[lVar14] = uVar4;
        iVar6 = vAig->nSize;
        lVar14 = lVar14 + 1;
        uVar7 = uVar12 + 2;
        iVar13 = uVar12 + 3;
        uVar12 = uVar7;
      } while (iVar13 < iVar6);
    }
    if (uVar7 != iVar6 - 1U) {
      __assert_fail("i == Vec_IntSize(vAig) - 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                    ,0x371,"int Gia_ManBuildFromMiniInt(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    if (iVar6 <= (int)uVar7) {
LAB_006ebc0f:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if ((int)uVar4 < 0) goto LAB_006ebc2e;
    uVar4 = uVar4 ^ 0 < vAig->pArray[uVar7];
    vAig->nSize = 0;
  }
  return uVar4;
}

Assistant:

int Gia_ManBuildFromMiniInt( Gia_Man_t * pNew, Vec_Int_t * vLeaves, Vec_Int_t * vAig, int fHash )
{
    assert( Vec_IntSize(vAig) > 0 );
    assert( Vec_IntEntryLast(vAig) < 2 );
    if ( Vec_IntSize(vAig) == 1 ) // const
        return Vec_IntEntry(vAig, 0);
    if ( Vec_IntSize(vAig) == 2 ) // variable
    {
        assert( Vec_IntEntry(vAig, 0) == 0 );
        assert( Vec_IntSize(vLeaves) == 1 );
        return Abc_LitNotCond( Vec_IntEntry(vLeaves, 0), Vec_IntEntry(vAig, 1) );
    }
    else
    {
        int nLeaves = Vec_IntSize(vLeaves);
        int i, iVar0, iVar1, iLit0, iLit1, iLit = 0;
        assert( Vec_IntSize(vAig) & 1 );
        Vec_IntForEachEntryDouble( vAig, iLit0, iLit1, i )
        {
            iVar0 = Abc_Lit2Var( iLit0 );
            iVar1 = Abc_Lit2Var( iLit1 );
            iLit0 = Abc_LitNotCond( iVar0 < nLeaves ? Vec_IntEntry(vLeaves, iVar0) : Vec_IntEntry(vAig, iVar0 - nLeaves), Abc_LitIsCompl(iLit0) );
            iLit1 = Abc_LitNotCond( iVar1 < nLeaves ? Vec_IntEntry(vLeaves, iVar1) : Vec_IntEntry(vAig, iVar1 - nLeaves), Abc_LitIsCompl(iLit1) );
            if ( fHash )
                iLit = Gia_ManHashAnd( pNew, iLit0, iLit1 );
            else if ( iLit0 == iLit1 )
                iLit = iLit0;
            else
                iLit = Gia_ManAppendAnd( pNew, iLit0, iLit1 );
            assert( (i & 1) == 0 );
            Vec_IntWriteEntry( vAig, Abc_Lit2Var(i), iLit );  // overwriting entries
        }
        assert( i == Vec_IntSize(vAig) - 1 );
        iLit = Abc_LitNotCond( iLit, Vec_IntEntry(vAig, i) );
        Vec_IntClear( vAig ); // useless
        return iLit;
    }
}